

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_copy_frame_mvs(AV1_COMMON *cm,MB_MODE_INFO *mi,int mi_row,int mi_col,int x_mis,int y_mis)

{
  char cVar1;
  ushort uVar2;
  MV_REF *pMVar3;
  int iVar4;
  int idx;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MV_REF *pMVar10;
  ushort uVar11;
  
  iVar7 = y_mis + 1 >> 1;
  if (0 < iVar7) {
    iVar6 = x_mis + 1 >> 1;
    iVar8 = (cm->mi_params).mi_cols + 1 >> 1;
    pMVar3 = cm->cur_frame->mvs + (long)((mi_row >> 1) * iVar8) + (long)(mi_col >> 1);
    iVar4 = 0;
    do {
      if (0 < iVar6) {
        iVar9 = 0;
        pMVar10 = pMVar3;
        do {
          pMVar10->ref_frame = -1;
          (pMVar10->mv).as_int = 0;
          lVar5 = 0;
          do {
            cVar1 = mi->ref_frame[lVar5];
            if ((0 < (long)cVar1) && (cm->ref_frame_side[cVar1] == '\0')) {
              uVar2 = mi->mv[lVar5].as_mv.row;
              uVar11 = -uVar2;
              if (0 < (short)uVar2) {
                uVar11 = uVar2;
              }
              if (uVar11 < 0x1000) {
                uVar2 = *(ushort *)((long)mi->mv + lVar5 * 4 + 2);
                uVar11 = -uVar2;
                if (0 < (short)uVar2) {
                  uVar11 = uVar2;
                }
                if (uVar11 < 0x1000) {
                  pMVar10->ref_frame = cVar1;
                  pMVar10->mv = mi->mv[lVar5];
                }
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 == 1);
          pMVar10 = pMVar10 + 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 != iVar6);
      }
      pMVar3 = pMVar3 + iVar8;
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar7);
  }
  return;
}

Assistant:

void av1_copy_frame_mvs(const AV1_COMMON *const cm,
                        const MB_MODE_INFO *const mi, int mi_row, int mi_col,
                        int x_mis, int y_mis) {
  const int frame_mvs_stride = ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, 1);
  MV_REF *frame_mvs =
      cm->cur_frame->mvs + (mi_row >> 1) * frame_mvs_stride + (mi_col >> 1);
  x_mis = ROUND_POWER_OF_TWO(x_mis, 1);
  y_mis = ROUND_POWER_OF_TWO(y_mis, 1);
  int w, h;

  for (h = 0; h < y_mis; h++) {
    MV_REF *mv = frame_mvs;
    for (w = 0; w < x_mis; w++) {
      mv->ref_frame = NONE_FRAME;
      mv->mv.as_int = 0;

      for (int idx = 0; idx < 2; ++idx) {
        MV_REFERENCE_FRAME ref_frame = mi->ref_frame[idx];
        if (ref_frame > INTRA_FRAME) {
          int8_t ref_idx = cm->ref_frame_side[ref_frame];
          if (ref_idx) continue;
          if ((abs(mi->mv[idx].as_mv.row) > REFMVS_LIMIT) ||
              (abs(mi->mv[idx].as_mv.col) > REFMVS_LIMIT))
            continue;
          mv->ref_frame = ref_frame;
          mv->mv.as_int = mi->mv[idx].as_int;
        }
      }
      mv++;
    }
    frame_mvs += frame_mvs_stride;
  }
}